

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback_ret.cpp
# Opt level: O0

long data_cb_ret_nframes(cubeb_stream *stream,void *user,void *inputbuffer,void *outputbuffer,
                        long nframes)

{
  bool bVar1;
  Message *message;
  char *message_00;
  long in_RCX;
  __atomic_base<int> *in_RSI;
  long in_R8;
  long i;
  short *ob;
  AssertionResult gtest_ar_;
  user_state_callback_ret *u;
  undefined8 in_stack_ffffffffffffff88;
  undefined1 success;
  String *in_stack_ffffffffffffff90;
  long lVar2;
  char (*in_stack_ffffffffffffff98) [42];
  Message *in_stack_ffffffffffffffa0;
  AssertHelper local_50 [2];
  AssertionResult local_40;
  __atomic_base<int> *local_30;
  long local_28;
  long local_20;
  
  success = (undefined1)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_30 = in_RSI;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::__atomic_base<int>::operator++(in_RSI,0);
  std::__atomic_base<int>::operator++(local_30 + 1,0);
  if (local_28 < 1) {
    testing::AssertionResult::AssertionResult
              ((AssertionResult *)in_stack_ffffffffffffff90,(bool)success);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
    if (!bVar1) {
      testing::Message::Message(in_stack_ffffffffffffffa0);
      message = testing::Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&stack0xffffffffffffffa0,&local_40,"false","false","true");
      message_00 = testing::internal::String::c_str((String *)&stack0xffffffffffffffa0);
      testing::internal::AssertHelper::AssertHelper
                (local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_callback_ret.cpp"
                 ,0x59,message_00);
      testing::internal::AssertHelper::operator=(local_50,message);
      testing::internal::AssertHelper::~AssertHelper(local_50);
      testing::internal::String::~String(in_stack_ffffffffffffff90);
      testing::Message::~Message((Message *)0x108943);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10894d);
  }
  if (local_20 != 0) {
    for (lVar2 = 0; lVar2 < local_28; lVar2 = lVar2 + 1) {
      *(undefined2 *)(local_20 + lVar2 * 2) = 0;
    }
  }
  return local_28;
}

Assistant:

long data_cb_ret_nframes(cubeb_stream * stream, void * user, const void * inputbuffer, void * outputbuffer, long nframes)
{
  user_state_callback_ret * u = (user_state_callback_ret *)user;
  u->cb_count++;
  // Every callback returns nframes, so every callback is expected
  u->expected_cb_count++;
  if (nframes < 1) {
    // This shouldn't happen
    EXPECT_TRUE(false) << "nframes should not be 0 in data callback!";
  }
  if (outputbuffer != NULL) {
    // If we have an output buffer insert silence
    short * ob = (short *) outputbuffer;
    for (long i = 0; i < nframes; i++) {
      ob[i] = 0;
    }
  }
  return nframes;
}